

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O0

uint lcp(uint32_t a,uint32_t b)

{
  uint B;
  uint A;
  uint32_t b_local;
  uint32_t a_local;
  
  if (a == b && a != 0) {
    __assert_fail("a != b or a==0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x3ff,"unsigned int lcp(uint32_t, uint32_t)");
  }
  if (((a & 0xff000000) == 0) || ((a & 0xff000000) != (b & 0xff000000))) {
    b_local = 0;
  }
  else if (((a & 0xff0000) == 0) || ((a & 0xff0000) != (b & 0xff0000))) {
    b_local = 1;
  }
  else if (((a & 0xff00) == 0) || ((a & 0xff00) != (b & 0xff00))) {
    b_local = 2;
  }
  else {
    b_local = 3;
  }
  return b_local;
}

Assistant:

static inline unsigned lcp(uint32_t a, uint32_t b)
{
	assert(a != b or a==0);
	unsigned A, B;
	A = 0xFF000000 & a;
	B = 0xFF000000 & b;
	if (A==0 or A!=B) return 0;
	A = 0x00FF0000 & a;
	B = 0x00FF0000 & b;
	if (A==0 or A!=B) return 1;
	A = 0x0000FF00 & a;
	B = 0x0000FF00 & b;
	if (A==0 or A!=B) return 2;
	return 3;
}